

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  int *__return_storage_ptr___00;
  uint uVar1;
  RawSchema *this_00;
  bool bVar2;
  unsigned_long *puVar3;
  uint64_t id;
  MethodList *in_R9;
  Range<unsigned_long> RVar4;
  StringPtr name_00;
  Schema local_1e0;
  Schema local_1d8;
  Maybe<capnp::InterfaceSchema::Method> local_1d0;
  uint local_184;
  undefined1 local_180 [4];
  uint location;
  Reader superclass;
  unsigned_long i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Reader local_f0;
  undefined1 local_c0 [8];
  Reader superclasses;
  Fault local_38;
  Fault f;
  uint *counter_local;
  InterfaceSchema *this_local;
  StringPtr name_local;
  Maybe<capnp::InterfaceSchema::Method> *result;
  
  name_00.content.ptr = (char *)name.content.size_;
  uVar1 = *counter;
  *counter = uVar1 + 1;
  f.exception = (Exception *)counter;
  if (uVar1 < 0x40) {
    this_00 = ((this->super_Schema).raw)->generic;
    __return_storage_ptr___00 = &superclasses.reader.nestingLimit;
    getMethods((MethodList *)__return_storage_ptr___00,this);
    name_00.content.size_ = (size_t)__return_storage_ptr___00;
    anon_unknown_33::findSchemaMemberByName<capnp::InterfaceSchema::MethodList>
              (__return_storage_ptr__,(anon_unknown_33 *)this_00,(RawSchema *)name.content.ptr,
               name_00,in_R9);
    bVar2 = kj::Maybe<capnp::InterfaceSchema::Method>::operator==
                      (__return_storage_ptr__,(void *)0x0);
    if (bVar2) {
      Schema::getProto((Reader *)&__range2,&this->super_Schema);
      capnp::schema::Node::Reader::getInterface(&local_f0,(Reader *)&__range2);
      capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)local_c0,&local_f0);
      RVar4 = kj::indices<capnp::List<capnp::schema::Superclass,(capnp::Kind)3>::Reader&>
                        ((Reader *)local_c0);
      __begin2.value = RVar4.begin_;
      __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
      while (bVar2 = kj::Range<unsigned_long>::Iterator::operator!=(&__end2,(Iterator *)&i), bVar2)
      {
        puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
        superclass._reader._40_8_ = *puVar3;
        List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_180,(Reader *)local_c0,superclass._reader.nestingLimit);
        local_184 = _::RawBrandedSchema::makeDepLocation(SUPERCLASS,superclass._reader.nestingLimit)
        ;
        id = capnp::schema::Superclass::Reader::getId((Reader *)local_180);
        local_1e0 = Schema::getDependency(&this->super_Schema,id,local_184);
        local_1d8.raw = (RawBrandedSchema *)Schema::asInterface(&local_1e0);
        findMethodByName(&local_1d0,(InterfaceSchema *)&local_1d8,name,(uint *)f.exception);
        kj::Maybe<capnp::InterfaceSchema::Method>::operator=(__return_storage_ptr__,&local_1d0);
        kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_1d0);
        bVar2 = kj::Maybe<capnp::InterfaceSchema::Method>::operator!=
                          (__return_storage_ptr__,(void *)0x0);
        if (bVar2) {
          return __return_storage_ptr__;
        }
        kj::Range<unsigned_long>::Iterator::operator++(&__end2);
      }
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x232,FAILED,"counter++ < MAX_SUPERCLASSES",
               "\"Cyclic or absurdly-large inheritance graph detected.\"",
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(__return_storage_ptr__,(void *)0x0);
    kj::_::Debug::Fault::~Fault(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == nullptr) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != nullptr) {
        break;
      }
    }
  }

  return result;
}